

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O3

void helicsAppFinalize(HelicsApp app,HelicsError *err)

{
  element_type *peVar1;
  AppObject *pAVar2;
  
  pAVar2 = helics::getAppObject(app,err);
  if ((pAVar2 != (AppObject *)0x0) &&
     (peVar1 = (pAVar2->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    (*peVar1->_vptr_App[5])();
  }
  return;
}

Assistant:

void helicsAppFinalize(HelicsApp app, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return;
    }
    try {
        happ->finalize();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}